

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O2

void png_filter_paeth(int stride,uchar *in,uchar *out,uchar *prev_line,int len)

{
  uint uVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  
  lVar2 = (long)stride;
  uVar5 = 0;
  uVar6 = (ulong)(uint)len;
  if (len < 1) {
    uVar6 = 0;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    if ((long)uVar5 < lVar2 || prev_line == (uchar *)0x0) {
      if (prev_line == (uchar *)0x0) {
        bVar3 = 0;
      }
      else {
        bVar3 = prev_line[uVar5];
      }
      if ((long)uVar5 < lVar2) {
        bVar7 = 0;
      }
      else {
        bVar7 = out[uVar5 - lVar2];
      }
      bVar4 = 0;
    }
    else {
      bVar7 = out[uVar5 - lVar2];
      bVar3 = prev_line[uVar5];
      bVar4 = prev_line[uVar5 - lVar2];
    }
    iVar9 = ((uint)bVar3 + (uint)bVar7) - (uint)bVar4;
    uVar11 = iVar9 - (uint)bVar7;
    uVar1 = -uVar11;
    if (0 < (int)uVar11) {
      uVar1 = uVar11;
    }
    uVar8 = iVar9 - (uint)bVar3;
    uVar11 = -uVar8;
    if (0 < (int)uVar8) {
      uVar11 = uVar8;
    }
    uVar10 = iVar9 - (uint)bVar4;
    uVar8 = -uVar10;
    if (0 < (int)uVar10) {
      uVar8 = uVar10;
    }
    if (uVar11 <= uVar8) {
      bVar4 = bVar3;
    }
    if (uVar8 < uVar1) {
      bVar7 = bVar4;
    }
    if (uVar11 < uVar1) {
      bVar7 = bVar4;
    }
    out[uVar5] = bVar7 + in[uVar5];
  }
  return;
}

Assistant:

static void png_filter_paeth(int stride, unsigned char* in, unsigned char* out, unsigned char* prev_line, int len)
{
	int i;
	unsigned char a;
	unsigned char b;
	unsigned char c;

	for(i = 0; i < len; i++)
	{
		if(prev_line && i >= stride)
		{
			a = out[i - stride];
			b = prev_line[i];
			c = prev_line[i - stride];
		}
		else
		{
			if(prev_line)
				b = prev_line[i];
			else
				b = 0;
	
			if(i >= stride)
				a = out[i - stride];
			else
				a = 0;

			c = 0;
		}

		out[i] = in[i] + png_paeth(a, b, c);
	}
}